

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O0

void u8_inc(char *s,int *i)

{
  int iVar1;
  int *i_local;
  char *s_local;
  
  iVar1 = *i;
  *i = iVar1 + 1;
  if ((((((int)s[iVar1] & 0x80U) != 0) && (((int)s[*i] & 0xc0U) == 0x80)) &&
      (*i = *i + 1, ((int)s[*i] & 0xc0U) == 0x80)) && (*i = *i + 1, ((int)s[*i] & 0xc0U) == 0x80)) {
    *i = *i + 1;
  }
  return;
}

Assistant:

void u8_inc(const char *s, int *i)
{
    if (s[(*i)++] & 0x80) {
        if (!isutf(s[*i])) {
            ++(*i);
            if (!isutf(s[*i])) {
                ++(*i);
                if (!isutf(s[*i])) {
                    ++(*i);
                }
            }
        }
    }
}